

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_multi_dim
          (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          span<const_unsigned_long,_18446744073709551615UL> *shape,semantic_tag tag,
          ser_context *context,error_code *ec)

{
  undefined7 in_register_00000011;
  uint64_t value;
  uint64_t *puVar1;
  
  value = 0x28;
  if ((int)CONCAT71(in_register_00000011,tag) == 0x10) {
    value = 0x410;
  }
  write_tag(this,value);
  visit_begin_array(this,2,none,context,ec);
  if ((ec->_M_value == 0) &&
     (visit_begin_array(this,shape->size_,none,context,ec), ec->_M_value == 0)) {
    puVar1 = shape->data_;
    do {
      if (puVar1 == shape->data_ + shape->size_) {
        visit_end_array(this,context,ec);
        return true;
      }
      visit_uint64(this,*puVar1,none,context,ec);
      puVar1 = puVar1 + 1;
    } while (ec->_M_value == 0);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_multi_dim(const jsoncons::span<const size_t>& shape,
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        switch (tag)
        {
            case semantic_tag::multi_dim_column_major:
                write_tag(1040);
                break;
            default:
                write_tag(40);
                break;
        }
        visit_begin_array(2, semantic_tag::none, context, ec);
        if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        visit_begin_array(shape.size(), semantic_tag::none, context, ec);
        if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        for (auto it = shape.begin(); it != shape.end(); ++it)
        {
            visit_uint64(*it, semantic_tag::none, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        }
        visit_end_array(context, ec);
        JSONCONS_VISITOR_RETURN;
    }